

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

IRet * __thiscall
vkt::shaderexecutor::
GenFunc<vkt::shaderexecutor::Signature<float,_float,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_2>
::doApply(IRet *__return_storage_ptr__,
         GenFunc<vkt::shaderexecutor::Signature<float,_float,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_2>
         *this,EvalContext *ctx,IArgs *iargs)

{
  bool *pbVar1;
  long lVar2;
  undefined8 local_68;
  double dStack_60;
  undefined8 local_58;
  bool *local_50;
  bool *local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  tcu::Vector<tcu::Interval,_2>::Vector(__return_storage_ptr__);
  for (lVar2 = 0; lVar2 != 0x30; lVar2 = lVar2 + 0x18) {
    local_50 = &iargs->a->m_data[0].m_hasNaN + lVar2;
    local_48 = &iargs->b->m_data[0].m_hasNaN + lVar2;
    local_40 = *(undefined4 *)&iargs->c;
    uStack_3c = *(undefined4 *)((long)&iargs->c + 4);
    uStack_38 = *(undefined4 *)&iargs->d;
    uStack_34 = *(undefined4 *)((long)&iargs->d + 4);
    (**(code **)(*(long *)this->m_func + 0x40))(&local_68,this->m_func,ctx,&local_50);
    *(undefined8 *)((long)&__return_storage_ptr__->m_data[0].m_hi + lVar2) = local_58;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar2;
    *(undefined8 *)pbVar1 = local_68;
    *(double *)(pbVar1 + 8) = dStack_60;
  }
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply					(const EvalContext& ctx, const IArgs& iargs) const
	{
		IRet ret;

		for (int ndx = 0; ndx < Size; ++ndx)
		{
			ret[ndx] =
				m_func.apply(ctx, iargs.a[ndx], iargs.b[ndx], iargs.c[ndx], iargs.d[ndx]);
		}

		return ret;
	}